

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::on_piece_fail_sync(torrent *this,piece_index_t piece,piece_block param_2)

{
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_00;
  peer_connection *this_01;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer pppVar3;
  
  if (((this->super_torrent_hot_members).field_0x4b & 4) == 0) {
    this_00._M_head_impl =
         (this->super_torrent_hot_members).m_picker._M_t.
         super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
         ._M_t.
         super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
         .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
    if (this_00._M_head_impl != (piece_picker *)0x0) {
      piece_picker::restore_piece(this_00._M_head_impl,piece,(span<const_int>)ZEXT816(0));
    }
    update_gauge(this);
    for (pppVar3 = (this->super_torrent_hot_members).m_connections.
                   super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   .
                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pppVar3 !=
        (this->super_torrent_hot_members).m_connections.
        super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        .
        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; pppVar3 = pppVar3 + 1) {
      this_01 = *pppVar3;
      if (((this_01->super_peer_connection_hot_members).field_0x28 & 0x10) == 0) {
        peer_connection::update_interest(this_01);
        if (((this->super_torrent_hot_members).field_0x4b & 4) == 0) {
          bVar1 = request_a_block(this,this_01);
          if (bVar1) {
            iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                      _vptr_session_logger[0x4b])();
            counters::inc_stats_counter((counters *)CONCAT44(extraout_var,iVar2),0x22,1);
          }
          peer_connection::send_block_requests(this_01);
        }
      }
    }
  }
  return;
}

Assistant:

void torrent::on_piece_fail_sync(piece_index_t const piece, piece_block) try
	{
		if (m_abort) return;

		// the user may have called force_recheck, which clears
		// the piece picker
		if (has_picker())
		{
			// unlock the piece and restore it, as if no block was
			// ever downloaded for it.
			m_picker->restore_piece(piece);
		}

		update_gauge();
		// some peers that previously was no longer interesting may
		// now have become interesting, since we lack this one piece now.
		for (auto i = begin(); i != end();)
		{
			peer_connection* p = *i;
			// update_interest may disconnect the peer and
			// invalidate the iterator
			++i;
			// no need to do anything with peers that
			// already are interested. Gaining a piece may
			// only make uninteresting peers interesting again.
			if (p->is_interesting()) continue;
			p->update_interest();
			if (!m_abort)
			{
				if (request_a_block(*this, *p))
					inc_stats_counter(counters::hash_fail_piece_picks);
				p->send_block_requests();
			}
		}
	}
	catch (...) { handle_exception(); }